

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

string * httplib::detail::if2ip(string *__return_storage_ptr__,string *ifn)

{
  bool bVar1;
  char *pcVar2;
  ifaddrs *piVar3;
  ifaddrs *ifap;
  char buf [16];
  undefined1 local_38 [8];
  
  piVar3 = (ifaddrs *)&ifap;
  getifaddrs(piVar3);
  do {
    piVar3 = piVar3->ifa_next;
    if (piVar3 == (ifaddrs *)0x0) {
      freeifaddrs(ifap);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      return __return_storage_ptr__;
    }
  } while ((((piVar3->ifa_addr == (sockaddr *)0x0) ||
            (bVar1 = std::operator==(ifn,piVar3->ifa_name), !bVar1)) ||
           (piVar3->ifa_addr->sa_family != 2)) ||
          (pcVar2 = inet_ntop(2,piVar3->ifa_addr->sa_data + 2,buf,0x10), pcVar2 == (char *)0x0));
  freeifaddrs(ifap);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,buf,local_38);
  return __return_storage_ptr__;
}

Assistant:

inline std::string if2ip(const std::string &ifn) {
			struct ifaddrs *ifap;
			getifaddrs(&ifap);
			for (auto ifa = ifap; ifa; ifa = ifa->ifa_next) {
				if (ifa->ifa_addr && ifn == ifa->ifa_name) {
					if (ifa->ifa_addr->sa_family == AF_INET) {
						auto sa = reinterpret_cast<struct sockaddr_in *>(ifa->ifa_addr);
						char buf[INET_ADDRSTRLEN];
						if (inet_ntop(AF_INET, &sa->sin_addr, buf, INET_ADDRSTRLEN)) {
							freeifaddrs(ifap);
							return std::string(buf, INET_ADDRSTRLEN);
						}
					}
				}
			}
			freeifaddrs(ifap);
			return std::string();
		}